

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O3

void * __thiscall Logger::async_write(Logger *this)

{
  int iVar1;
  lock_guard<std::mutex> lck;
  string single_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  while( true ) {
    buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pop(this->l_buffer_queue,&local_40);
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->l_mutex);
    if (iVar1 != 0) break;
    fputs(local_40._M_dataplus._M_p,(FILE *)this->l_fp);
    pthread_mutex_unlock((pthread_mutex_t *)&this->l_mutex);
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void *async_write()
    {
        string single_line;
        //@ assuming that no thread pushes elements in, once async writing thread starts, it falls in sleep
        //  and will never be awaken. To deal with that, an interface "notify" is introduced in buffer_queue.
        //  In destruction func, notify is called to wake up this thread and let it stop naturally.
        //@ assuming that pop func returns false under spurious wakeup, the loop will be over as well as the async writing thread,
        //  which is not what we expected. So the variable is_thread_stop is introduced. Only in destruction func will it be setted,
        //  combining with the notify func, the thread can finish normally. Anothor function of is_thread_stop is to terminate the
        // busy loop of pushing operation in write_log func when this class comes to end.
        while(l_buffer_queue->pop(single_line) && !is_thread_stop)
        {
            lock_guard<mutex> lck (l_mutex);
            fputs(single_line.c_str(), l_fp); 
        }   
    }